

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resizable_buffer.hpp
# Opt level: O3

void __thiscall
duckdb::ResizeableBuffer::resize(ResizeableBuffer *this,Allocator *allocator,uint64_t new_size)

{
  idx_t size;
  uint64_t uVar1;
  data_ptr_t pointer;
  AllocatedData local_40;
  
  (this->super_ByteBuffer).len = new_size;
  if ((new_size != 0) && (this->alloc_len < new_size)) {
    uVar1 = NextPowerOfTwo(new_size);
    this->alloc_len = uVar1;
    AllocatedData::Reset(&this->allocated_data);
    size = this->alloc_len;
    pointer = Allocator::AllocateData(allocator,size);
    AllocatedData::AllocatedData(&local_40,allocator,pointer,size);
    AllocatedData::operator=(&this->allocated_data,&local_40);
    AllocatedData::~AllocatedData(&local_40);
    (this->super_ByteBuffer).ptr = (this->allocated_data).pointer;
  }
  return;
}

Assistant:

void resize(Allocator &allocator, const uint64_t new_size) {
		len = new_size;
		if (new_size == 0) {
			return;
		}
		if (new_size > alloc_len) {
			alloc_len = NextPowerOfTwo(new_size);
			allocated_data.Reset(); // Have to reset before allocating new buffer (otherwise we use ~2x the memory)
			allocated_data = allocator.Allocate(alloc_len);
			ptr = allocated_data.get();
		}
	}